

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall Liby::Connection::handleErroEvent(Connection *this)

{
  shared_ptr<Liby::Connection> x;
  __shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> a_Stack_18 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Liby::Connection,void>
            (a_Stack_18,
             (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<Liby::Connection>);
  if ((this->erroEventCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->erroEventCallback_)._M_invoker)((_Any_data *)&this->erroEventCallback_,this);
  }
  destroy(this);
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

void Connection::handleErroEvent() {
    auto x = shared_from_this();
    if (erroEventCallback_) {
        erroEventCallback_(*this);
    }
    destroy();
}